

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_BrepFace::SetMesh(ON_BrepFace *this,mesh_type mt,ON_Mesh *mesh)

{
  bool local_29;
  bool rc;
  lock_guard<std::recursive_mutex> lock;
  ON_Mesh *mesh_local;
  mesh_type mt_local;
  ON_BrepFace *this_local;
  
  lock._M_device = (mutex_type *)mesh;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&stack0xffffffffffffffd8,
             &this->m_pImpl->m_mesh_mutex);
  local_29 = true;
  if (mt == render_mesh) {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Mesh>
              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this->m_pImpl,
               (ON_Mesh *)lock._M_device);
  }
  else if (mt == analysis_mesh) {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Mesh>
              (&(this->m_pImpl->m_analysis_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,
               (ON_Mesh *)lock._M_device);
  }
  else if (mt == preview_mesh) {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Mesh>
              (&(this->m_pImpl->m_preview_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,
               (ON_Mesh *)lock._M_device);
  }
  else {
    local_29 = false;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard
            ((lock_guard<std::recursive_mutex> *)&stack0xffffffffffffffd8);
  return local_29;
}

Assistant:

bool ON_BrepFace::SetMesh(ON::mesh_type mt, ON_Mesh* mesh)
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  bool rc = true;
  switch (mt)
  {
  case ON::render_mesh:
    m_pImpl->m_render_mesh.reset(mesh);
    break;
  case ON::analysis_mesh:
    m_pImpl->m_analysis_mesh.reset(mesh);
    break;
  case ON::preview_mesh:
    m_pImpl->m_preview_mesh.reset(mesh);
    break;
  default:
    rc = false;
  }

  return rc;
}